

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult tonk_send(TonkConnection connection,void *data,uint64_t bytes,uint32_t channel)

{
  long in_RDI;
  Result result;
  Connection *tonkConnection;
  uint64_t in_stack_000000e0;
  uint8_t *in_stack_000000e8;
  uint in_stack_000000f4;
  Connection *in_stack_000000f8;
  Result *result_00;
  Result local_38 [6];
  TonkResult local_4;
  
  if (in_RDI == 0) {
    local_4 = Tonk_InvalidInput;
  }
  else {
    result_00 = local_38;
    tonk::Connection::tonk_send
              (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,in_stack_000000e0);
    local_4 = TonkResultFromDetailedResult(result_00);
    tonk::Result::~Result(result_00);
  }
  return local_4;
}

Assistant:

TONK_EXPORT TonkResult tonk_send(
    TonkConnection      connection, // Connection to send on
    const void*               data, // Pointer to message data
    uint64_t                 bytes, // Message bytes
    uint32_t               channel  // Channel to attach to message
)
{
    Connection* tonkConnection = reinterpret_cast<Connection*>(connection);
    if (!tonkConnection)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = tonkConnection->tonk_send(
        channel,
        reinterpret_cast<const uint8_t*>(data),
        bytes);
    return TonkResultFromDetailedResult(result);
}